

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

uint32_t FAPOBase_ValidateFormatPair
                   (FAPOBase *fapo,FAudioWaveFormatEx *pSupportedFormat,
                   FAudioWaveFormatEx *pRequestedFormat,uint8_t fOverwrite)

{
  uint16_t uVar1;
  uint32_t local_34;
  uint32_t local_30;
  uint8_t fOverwrite_local;
  FAudioWaveFormatEx *pRequestedFormat_local;
  FAudioWaveFormatEx *pSupportedFormat_local;
  FAPOBase *fapo_local;
  uint32_t local_4;
  
  if ((((pRequestedFormat->wFormatTag == 3) && (pRequestedFormat->nChannels != 0)) &&
      (pRequestedFormat->nChannels < 0x41)) &&
     (((999 < pRequestedFormat->nSamplesPerSec && (pRequestedFormat->nSamplesPerSec < 0x30d41)) &&
      (pRequestedFormat->wBitsPerSample == 0x20)))) {
    local_4 = 0;
  }
  else {
    if (fOverwrite != '\0') {
      pRequestedFormat->wFormatTag = 3;
      if (pRequestedFormat->nChannels < 0x41) {
        if (pRequestedFormat->nChannels == 0) {
          uVar1 = 1;
        }
        else {
          uVar1 = pRequestedFormat->nChannels;
        }
      }
      else {
        uVar1 = 0x40;
      }
      pRequestedFormat->nChannels = uVar1;
      if (pRequestedFormat->nSamplesPerSec < 0x30d41) {
        if (pRequestedFormat->nSamplesPerSec < 1000) {
          local_34 = 1000;
        }
        else {
          local_34 = pRequestedFormat->nSamplesPerSec;
        }
        local_30 = local_34;
      }
      else {
        local_30 = 200000;
      }
      pRequestedFormat->nSamplesPerSec = local_30;
      pRequestedFormat->wBitsPerSample = 0x20;
    }
    local_4 = 0x88970001;
  }
  return local_4;
}

Assistant:

uint32_t FAPOBase_ValidateFormatPair(
	FAPOBase *fapo,
	const FAudioWaveFormatEx *pSupportedFormat,
	FAudioWaveFormatEx *pRequestedFormat,
	uint8_t fOverwrite
) {
	if (	pRequestedFormat->wFormatTag != FAPOBASE_DEFAULT_FORMAT_TAG ||
		pRequestedFormat->nChannels < FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS ||
		pRequestedFormat->nChannels > FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS ||
		pRequestedFormat->nSamplesPerSec < FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE ||
		pRequestedFormat->nSamplesPerSec > FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE ||
		pRequestedFormat->wBitsPerSample != FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE	)
	{
		if (fOverwrite)
		{
			pRequestedFormat->wFormatTag =
				FAPOBASE_DEFAULT_FORMAT_TAG;
			pRequestedFormat->nChannels = FAudio_clamp(
				pRequestedFormat->nChannels,
				FAPOBASE_DEFAULT_FORMAT_MIN_CHANNELS,
				FAPOBASE_DEFAULT_FORMAT_MAX_CHANNELS
			);
			pRequestedFormat->nSamplesPerSec = FAudio_clamp(
				pRequestedFormat->nSamplesPerSec,
				FAPOBASE_DEFAULT_FORMAT_MIN_FRAMERATE,
				FAPOBASE_DEFAULT_FORMAT_MAX_FRAMERATE
			);
			pRequestedFormat->wBitsPerSample =
				FAPOBASE_DEFAULT_FORMAT_BITSPERSAMPLE;
		}
		return FAPO_E_FORMAT_UNSUPPORTED;
	}
	return 0;
}